

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cte.h
# Opt level: O0

void __thiscall merlin::detail::node::clear(node *this)

{
  factor *rhs;
  factor local_70;
  node *local_10;
  node *this_local;
  
  local_10 = this;
  variable_set::clear(&this->clique);
  factor::factor(&local_70,1.0);
  rhs = factor::operator=(&this->belief,&local_70);
  factor::operator=(&this->theta,rhs);
  factor::~factor(&local_70);
  this->parent = (node *)0x0;
  std::vector<merlin::detail::node_*,_std::allocator<merlin::detail::node_*>_>::clear
            (&this->children);
  this->weight = 0.0;
  return;
}

Assistant:

void clear() {
			clique.clear();
			theta = belief = factor(1.0);
			parent = NULL; children.clear();
			weight = 0.0;
		}